

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_get.c
# Opt level: O3

int buffer_bget(buffer *s,char *buf,uint len)

{
  uint uVar1;
  _func_int_varargs *p_Var2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  
  uVar3 = s->p;
  if (uVar3 == 0) {
    uVar3 = s->n;
    if (uVar3 <= len) {
      p_Var2 = s->op;
      uVar1 = s->fd;
      do {
        iVar4 = (*p_Var2)((ulong)uVar1,buf,(ulong)uVar3);
        if (iVar4 != -1) {
          return iVar4;
        }
        piVar5 = __errno_location();
      } while (*piVar5 == error_intr);
      return -1;
    }
    iVar4 = buffer_feed(s);
    if (iVar4 < 1) {
      return iVar4;
    }
    uVar3 = s->p;
  }
  if (uVar3 < len) {
    len = uVar3;
  }
  s->p = uVar3 - len;
  byte_copy(buf,len,s->x + s->n);
  s->n = s->n + len;
  return len;
}

Assistant:

int buffer_bget(buffer *s,char *buf,unsigned int len)
{
  int r;
 
  if (s->p > 0) return getthis(s,buf,len);
  if (s->n <= len) return oneread(s->op,s->fd,buf,s->n);
  r = buffer_feed(s); if (r <= 0) return r;
  return getthis(s,buf,len);
}